

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int client_handle_new_session_ticket(ptls_t *tls,ptls_iovec_t message)

{
  uint8_t *src;
  size_t sVar1;
  st_ptls_get_time_t *psVar2;
  st_ptls_save_ticket_t *psVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_t sVar6;
  byte bVar7;
  ushort uVar8;
  int iVar9;
  uint64_t uVar10;
  ptls_iovec_t *__ptr;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  ptls_iovec_t pVar15;
  uint32_t ticket_lifetime;
  size_t local_268;
  size_t local_260;
  int local_258;
  uint32_t max_early_data_size;
  uint32_t ticket_age_add;
  ptls_iovec_t ticket_nonce;
  uint8_t ticket_buf_small [512];
  
  src = message.base + 4;
  iVar9 = decode_new_session_ticket
                    (tls,&ticket_lifetime,&ticket_age_add,&ticket_nonce,
                     (ptls_iovec_t *)ticket_buf_small,&max_early_data_size,src,
                     message.base + message.len);
  if (iVar9 == 0) {
    if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
      iVar9 = 0;
    }
    else {
      local_260 = 0;
      local_268 = 0x200;
      local_258 = 0;
      psVar2 = tls->ctx->get_time;
      _ticket_lifetime = (ptls_iovec_t *)ticket_buf_small;
      uVar10 = (*psVar2->cb)(psVar2);
      iVar9 = ptls_buffer_reserve((ptls_buffer_t *)&ticket_lifetime,8);
      __ptr = _ticket_lifetime;
      sVar13 = local_260;
      if (iVar9 == 0) {
        *(uint64_t *)((long)&_ticket_lifetime->base + local_260) =
             uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
             (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
             (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28 |
             uVar10 << 0x38;
        local_260 = local_260 + 8;
        uVar8 = tls->key_share->id;
        iVar9 = ptls_buffer_reserve((ptls_buffer_t *)&ticket_lifetime,2);
        __ptr = _ticket_lifetime;
        sVar13 = local_260;
        if (iVar9 == 0) {
          *(ushort *)((long)&_ticket_lifetime->base + local_260) = uVar8 << 8 | uVar8 >> 8;
          local_260 = local_260 + 2;
          uVar8 = tls->cipher_suite->id;
          iVar9 = ptls_buffer_reserve((ptls_buffer_t *)&ticket_lifetime,2);
          __ptr = _ticket_lifetime;
          sVar13 = local_260;
          if (iVar9 == 0) {
            *(ushort *)((long)&_ticket_lifetime->base + local_260) = uVar8 << 8 | uVar8 >> 8;
            local_260 = local_260 + 2;
            iVar9 = ptls_buffer_reserve((ptls_buffer_t *)&ticket_lifetime,3);
            sVar6 = local_260;
            __ptr = _ticket_lifetime;
            sVar13 = local_260;
            if (iVar9 == 0) {
              *(undefined1 *)((long)&_ticket_lifetime->base + local_260 + 2) = 0;
              *(undefined2 *)((long)&_ticket_lifetime->base + local_260) = 0;
              sVar1 = local_260 + 3;
              local_260 = sVar1;
              iVar9 = ptls_buffer__do_pushv((ptls_buffer_t *)&ticket_lifetime,src,message.len - 4);
              auVar5 = _DAT_0011d250;
              auVar4 = _DAT_0011d240;
              __ptr = _ticket_lifetime;
              sVar13 = local_260;
              if (iVar9 == 0) {
                uVar11 = local_260 - sVar1;
                bVar7 = 0x10;
                lVar12 = 0;
                do {
                  auVar14._8_4_ = (int)lVar12;
                  auVar14._0_8_ = lVar12;
                  auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
                  auVar14 = (auVar14 | auVar4) ^ auVar5;
                  if (auVar14._4_4_ == -0x80000000 && auVar14._0_4_ < -0x7ffffffd) {
                    *(char *)((long)&_ticket_lifetime->base + lVar12 + sVar6) =
                         (char)(uVar11 >> (bVar7 & 0x3f));
                    *(char *)((long)&_ticket_lifetime->base + lVar12 + sVar6 + 1) =
                         (char)(uVar11 >> (bVar7 - 8 & 0x3f));
                  }
                  lVar12 = lVar12 + 2;
                  bVar7 = bVar7 - 0x10;
                } while (lVar12 != 4);
                iVar9 = ptls_buffer_reserve((ptls_buffer_t *)&ticket_lifetime,2);
                sVar6 = local_260;
                __ptr = _ticket_lifetime;
                sVar13 = local_260;
                if (iVar9 == 0) {
                  *(undefined2 *)((long)&_ticket_lifetime->base + local_260) = 0;
                  sVar1 = local_260 + 2;
                  local_260 = sVar1;
                  iVar9 = ptls_buffer_reserve((ptls_buffer_t *)&ticket_lifetime,
                                              (tls->key_schedule->hashes[0].algo)->digest_size);
                  sVar13 = local_260;
                  __ptr = _ticket_lifetime;
                  if ((iVar9 == 0) &&
                     (iVar9 = derive_resumption_secret
                                        (tls->key_schedule,
                                         (uint8_t *)((long)&_ticket_lifetime->base + local_260),
                                         ticket_nonce), iVar9 == 0)) {
                    sVar13 = sVar13 + (tls->key_schedule->hashes[0].algo)->digest_size;
                    uVar8 = (short)sVar13 - (short)sVar1;
                    *(ushort *)((long)&__ptr->base + sVar6) = uVar8 * 0x100 | uVar8 >> 8;
                    psVar3 = tls->ctx->save_ticket;
                    pVar15.len = sVar13;
                    pVar15.base = (uint8_t *)__ptr;
                    iVar9 = (*psVar3->cb)(psVar3,tls,pVar15);
                  }
                }
              }
            }
          }
        }
      }
      (*ptls_clear_memory)(__ptr,sVar13);
      if (local_258 != 0) {
        free(__ptr);
      }
    }
  }
  return iVar9;
}

Assistant:

static int client_handle_new_session_ticket(ptls_t *tls, ptls_iovec_t message)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    ptls_iovec_t ticket_nonce;
    int ret;

    { /* verify the format */
        uint32_t ticket_lifetime, ticket_age_add, max_early_data_size;
        ptls_iovec_t ticket;
        if ((ret = decode_new_session_ticket(tls, &ticket_lifetime, &ticket_age_add, &ticket_nonce, &ticket, &max_early_data_size,
                                             src, end)) != 0)
            return ret;
    }

    /* do nothing if use of session ticket is disabled */
    if (tls->ctx->save_ticket == NULL)
        return 0;

    /* save the extension, along with the key of myself */
    ptls_buffer_t ticket_buf;
    uint8_t ticket_buf_small[512];
    ptls_buffer_init(&ticket_buf, ticket_buf_small, sizeof(ticket_buf_small));
    ptls_buffer_push64(&ticket_buf, tls->ctx->get_time->cb(tls->ctx->get_time));
    ptls_buffer_push16(&ticket_buf, tls->key_share->id);
    ptls_buffer_push16(&ticket_buf, tls->cipher_suite->id);
    ptls_buffer_push_block(&ticket_buf, 3, { ptls_buffer_pushv(&ticket_buf, src, end - src); });
    ptls_buffer_push_block(&ticket_buf, 2, {
        if ((ret = ptls_buffer_reserve(&ticket_buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = derive_resumption_secret(tls->key_schedule, ticket_buf.base + ticket_buf.off, ticket_nonce)) != 0)
            goto Exit;
        ticket_buf.off += tls->key_schedule->hashes[0].algo->digest_size;
    });

    if ((ret = tls->ctx->save_ticket->cb(tls->ctx->save_ticket, tls, ptls_iovec_init(ticket_buf.base, ticket_buf.off))) != 0)
        goto Exit;

    ret = 0;
Exit:
    ptls_buffer_dispose(&ticket_buf);
    return ret;
}